

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O0

const_iterator soplex::findSubStringIC(string *substr,string *str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  
  uVar1 = std::__cxx11::string::begin();
  uVar2 = std::__cxx11::string::end();
  uVar3 = std::__cxx11::string::begin();
  uVar4 = std::__cxx11::string::end();
  _Var5 = std::
          search<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,soplex::findSubStringIC(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
                    (uVar1,uVar2,uVar3,uVar4);
  return (const_iterator)_Var5._M_current;
}

Assistant:

static
std::string::const_iterator findSubStringIC(const std::string& substr, const std::string& str)
{
   auto it = std::search(
                str.begin(), str.end(),
                substr.begin(),   substr.end(),
                [](char ch1, char ch2)
   {
      return std::toupper(ch1) == std::toupper(ch2);
   }
             );
   return it;
}